

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderMps.cpp
# Opt level: O2

HighsStatus __thiscall
FilereaderMps::writeModelToFile
          (FilereaderMps *this,HighsOptions *options,string *filename,HighsModel *model)

{
  HighsStatus HVar1;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)filename);
  HVar1 = writeModelAsMps(options,&sStack_38,model,
                          (options->super_HighsOptionsStruct).mps_parser_type_free);
  std::__cxx11::string::~string((string *)&sStack_38);
  return HVar1;
}

Assistant:

HighsStatus FilereaderMps::writeModelToFile(const HighsOptions& options,
                                            const std::string filename,
                                            const HighsModel& model) {
  assert(model.lp_.a_matrix_.isColwise());
  return writeModelAsMps(options, filename, model,
                         options.mps_parser_type_free);
}